

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void continuous_dist_test_streamable<trng::uniform_dist<float>>(uniform_dist<float> *d)

{
  StringRef capturedExpression;
  bool bVar1;
  AssertionHandler *this;
  uniform_dist<float> *in_RDI;
  AssertionHandler catchAssertionHandler;
  uniform_dist<float> d_new;
  stringstream str;
  param_type p_new;
  undefined4 in_stack_fffffffffffffda8;
  undefined2 in_stack_fffffffffffffdac;
  undefined1 in_stack_fffffffffffffdae;
  undefined1 in_stack_fffffffffffffdaf;
  char *in_stack_fffffffffffffdb0;
  AssertionHandler *this_00;
  StringRef *macroName;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffdd0;
  ExprLhs<bool> *in_stack_fffffffffffffdd8;
  AssertionHandler *in_stack_fffffffffffffde0;
  param_type *in_stack_fffffffffffffde8;
  basic_istream<char,_std::char_traits<char>_> *in_stack_fffffffffffffdf0;
  uniform_dist<float> local_1b8 [2];
  stringstream local_1a0 [16];
  StringRef local_190 [23];
  param_type local_14;
  uniform_dist<float> *local_8;
  
  local_8 = in_RDI;
  trng::uniform_dist<float>::param_type::param_type(&local_14);
  std::__cxx11::stringstream::stringstream(local_1a0);
  macroName = local_190;
  this = (AssertionHandler *)trng::uniform_dist<float>::param(local_8);
  trng::operator<<(in_stack_fffffffffffffdd0,
                   (param_type *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
  trng::operator>>(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  trng::uniform_dist<float>::uniform_dist(local_1b8,&local_14);
  operator____catch_sr
            (in_stack_fffffffffffffdb0,
             CONCAT17(in_stack_fffffffffffffdaf,
                      CONCAT16(in_stack_fffffffffffffdae,
                               CONCAT24(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8))));
  this_00 = (AssertionHandler *)&stack0xfffffffffffffde0;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0xcd);
  Catch::StringRef::StringRef((StringRef *)this,(char *)macroName);
  capturedExpression.m_start._7_1_ = in_stack_fffffffffffffdcf;
  capturedExpression.m_start._0_7_ = in_stack_fffffffffffffdc8;
  capturedExpression.m_size = (size_type)in_stack_fffffffffffffdd0;
  Catch::AssertionHandler::AssertionHandler
            (this,macroName,(SourceLineInfo *)this_00,capturedExpression,
             CONCAT13(in_stack_fffffffffffffdaf,
                      CONCAT12(in_stack_fffffffffffffdae,in_stack_fffffffffffffdac)));
  bVar1 = trng::operator==((uniform_dist<float> *)this_00,
                           (uniform_dist<float> *)
                           CONCAT17(in_stack_fffffffffffffdaf,
                                    CONCAT16(in_stack_fffffffffffffdae,
                                             CONCAT24(in_stack_fffffffffffffdac,
                                                      in_stack_fffffffffffffda8))));
  Catch::Decomposer::operator<=
            ((Decomposer *)
             CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffdae,
                                     CONCAT24(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)))
             ,false);
  Catch::AssertionHandler::handleExpr<bool>(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  Catch::AssertionHandler::complete(this_00);
  Catch::AssertionHandler::~AssertionHandler(this_00);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void continuous_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE((d == d_new));
}